

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<CPP::WriteInitialization::Buddy>::moveAppend
          (QGenericArrayOps<CPP::WriteInitialization::Buddy> *this,Buddy *b,Buddy *e)

{
  Buddy *pBVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  
  if ((b != e) && (b < e)) {
    pBVar1 = (this->super_QArrayDataPointer<CPP::WriteInitialization::Buddy>).ptr;
    qVar5 = (this->super_QArrayDataPointer<CPP::WriteInitialization::Buddy>).size;
    do {
      pDVar2 = (b->labelVarName).d.d;
      (b->labelVarName).d.d = (Data *)0x0;
      pBVar1[qVar5].labelVarName.d.d = pDVar2;
      pcVar3 = (b->labelVarName).d.ptr;
      (b->labelVarName).d.ptr = (char16_t *)0x0;
      pBVar1[qVar5].labelVarName.d.ptr = pcVar3;
      qVar4 = (b->labelVarName).d.size;
      (b->labelVarName).d.size = 0;
      pBVar1[qVar5].labelVarName.d.size = qVar4;
      pDVar2 = (b->buddyAttributeName).d.d;
      (b->buddyAttributeName).d.d = (Data *)0x0;
      pBVar1[qVar5].buddyAttributeName.d.d = pDVar2;
      pcVar3 = (b->buddyAttributeName).d.ptr;
      (b->buddyAttributeName).d.ptr = (char16_t *)0x0;
      pBVar1[qVar5].buddyAttributeName.d.ptr = pcVar3;
      qVar4 = (b->buddyAttributeName).d.size;
      (b->buddyAttributeName).d.size = 0;
      pBVar1[qVar5].buddyAttributeName.d.size = qVar4;
      b = b + 1;
      qVar5 = (this->super_QArrayDataPointer<CPP::WriteInitialization::Buddy>).size + 1;
      (this->super_QArrayDataPointer<CPP::WriteInitialization::Buddy>).size = qVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }